

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGlyphs.cpp
# Opt level: O3

void __thiscall
chrono::ChGlyphs::SetGlyphCoordsys(ChGlyphs *this,uint id,ChCoordsys<double> *mcoord)

{
  ChCoordsys<double> *pCVar1;
  pointer pCVar2;
  pointer pCVar3;
  ulong uVar4;
  ulong uVar5;
  
  pCVar2 = (this->points).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (ulong)id;
  uVar4 = ((long)(this->points).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2 >> 3) *
          -0x5555555555555555;
  if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
              (&this->points,(ulong)(id + 1));
    pCVar2 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pCVar1 = (ChCoordsys<double> *)(pCVar2 + uVar5);
  if (pCVar1 != mcoord) {
    (pCVar1->pos).m_data[0] = (mcoord->pos).m_data[0];
    (pCVar1->pos).m_data[1] = (mcoord->pos).m_data[1];
    (pCVar1->pos).m_data[2] = (mcoord->pos).m_data[2];
  }
  pCVar3 = (this->rotations).
           super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->rotations).
                    super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 5) <= uVar5) {
    std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
    resize(&this->rotations,(ulong)(id + 1));
    pCVar3 = (this->rotations).
             super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pCVar3 = pCVar3 + uVar5;
  if (&mcoord->rot != pCVar3) {
    pCVar3->m_data[0] = (mcoord->rot).m_data[0];
    pCVar3->m_data[1] = (mcoord->rot).m_data[1];
    pCVar3->m_data[2] = (mcoord->rot).m_data[2];
    pCVar3->m_data[3] = (mcoord->rot).m_data[3];
  }
  return;
}

Assistant:

void ChGlyphs::SetGlyphCoordsys(unsigned int id, ChCoordsys<> mcoord) {
    if (points.size() <= id)
        points.resize(id + 1);
    points[id] = mcoord.pos;

    if (rotations.size() <= id)
        rotations.resize(id + 1);
    rotations[id] = mcoord.rot;
}